

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesShaft::Compute_inc_Mb_v
          (ChVariablesShaft *this,ChVectorRef *result,ChVectorConstRef vect)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint __line;
  int iVar4;
  Scalar *pSVar5;
  char *__assertion;
  CoeffReturnType CVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar3 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar4 = (*(this->super_ChVariables)._vptr_ChVariables[2])();
  if (lVar3 == iVar4) {
    lVar3 = (vect->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_rows.m_value;
    iVar4 = (*(this->super_ChVariables)._vptr_ChVariables[2])(this);
    if (lVar3 == iVar4) {
      dVar1 = this->m_inertia;
      CVar6 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)vect,0);
      pSVar5 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                             *)result,0);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = CVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pSVar5;
      auVar2 = vfmadd213sd_fma(auVar8,auVar7,auVar2);
      *pSVar5 = auVar2._0_8_;
      return;
    }
    __assertion = "vect.size() == Get_ndof()";
    __line = 0x40;
  }
  else {
    __assertion = "result.size() == Get_ndof()";
    __line = 0x3f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesShaft.cpp"
                ,__line,
                "virtual void chrono::ChVariablesShaft::Compute_inc_Mb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesShaft::Compute_inc_Mb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == Get_ndof());
    assert(vect.size() == Get_ndof());

    result(0) += m_inertia * vect(0);
}